

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soac.cpp
# Opt level: O2

string * __thiscall Member::GetType_abi_cxx11_(string *__return_storage_ptr__,Member *this)

{
  int i;
  int iVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->isConst == true) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  for (iVar1 = 0; iVar1 < this->numPointers; iVar1 = iVar1 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetType() const {
        std::string s;
        if (isConst)
            s = "const ";
        s += type;
        for (int i = 0; i < numPointers; ++i)
            s += "*";
        return s;
    }